

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadTimeUnit(Scl_Tree_t *p)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *__s1;
  int *piVar3;
  
  piVar3 = &p->pItems->Child;
  do {
    pSVar2 = Scl_LibertyItem(p,*piVar3);
    if (pSVar2 == (Scl_Item_t *)0x0) {
LAB_00352593:
      puts("Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".");
      return 9;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"time_unit");
    if (iVar1 == 0) {
      __s1 = Scl_LibertyReadString(p,pSVar2->Head);
      iVar1 = strcmp(__s1,"1ns");
      if (iVar1 == 0) {
        return 9;
      }
      iVar1 = strcmp(__s1,"100ps");
      if (iVar1 == 0) {
        return 10;
      }
      iVar1 = strcmp(__s1,"10ps");
      if (iVar1 == 0) {
        return 0xb;
      }
      iVar1 = strcmp(__s1,"1ps");
      if (iVar1 == 0) {
        return 0xc;
      }
      goto LAB_00352593;
    }
    piVar3 = &pSVar2->Next;
  } while( true );
}

Assistant:

int Scl_LibertyReadTimeUnit( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "time_unit" )
    {
        char * pUnit = Scl_LibertyReadString(p, pItem->Head);
        // 9=1ns, 10=100ps, 11=10ps, 12=1ps
        if ( !strcmp(pUnit, "1ns") )
            return 9;
        if ( !strcmp(pUnit, "100ps") )
            return 10;
        if ( !strcmp(pUnit, "10ps") )
            return 11;
        if ( !strcmp(pUnit, "1ps") )
            return 12;
        break;
    }
    printf( "Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".\n" );
    return 9;
}